

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename,uint quality)

{
  undefined4 in_EAX;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  FILE *pFVar5;
  CImgIOException *this_00;
  char cVar6;
  uint k;
  long lVar7;
  pointer_____offset_0x10___ *ppuVar8;
  uint uVar9;
  char *pcVar10;
  undefined1 auVar11 [16];
  timeval st_time;
  char filetmp [512];
  char command [1024];
  
  if (filename == (char *)0x0) {
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char");
    ppuVar8 = &CImgArgumentException::typeinfo;
  }
  else if ((this->_data == (uchar *)0x0) ||
          (auVar11._0_4_ = -(uint)(this->_width == 0), auVar11._4_4_ = -(uint)(this->_height == 0),
          auVar11._8_4_ = -(uint)(this->_depth == 0), auVar11._12_4_ = -(uint)(this->_spectrum == 0)
          , uVar1 = movmskps(in_EAX,auVar11), (char)uVar1 != '\0')) {
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgInstanceException::CImgInstanceException
              ((CImgInstanceException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Empty instance, for file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char",filename);
    ppuVar8 = &CImgInstanceException::typeinfo;
  }
  else {
    memset(command,0,0x400);
    memset(filetmp,0,0x200);
    while( true ) {
      pcVar4 = cimg::temporary_path((char *)0x0,false);
      if (cimg::srand()::first_time == '\x01') {
        gettimeofday((timeval *)&st_time,(__timezone_ptr_t)0x0);
        uVar9 = (int)st_time.tv_sec * 1000 +
                ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(st_time.tv_usec),8) >> 7) -
                (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(st_time.tv_usec),0xc) >> 0x1f));
        srand(uVar9);
        rand();
        rand();
        srand(uVar9);
        cimg::srand()::first_time = '\0';
      }
      lVar7 = 0;
      do {
        iVar2 = rand();
        iVar3 = rand();
        if (iVar2 % 3 == 0) {
          cVar6 = '0';
          iVar2 = 10;
        }
        else {
          if (iVar2 % 3 == 1) {
            cVar6 = 'a';
          }
          else {
            cVar6 = 'A';
          }
          iVar2 = 0x1a;
        }
        (&cimg::filenamerand()::randomid)[lVar7] = (char)(iVar3 % iVar2) + cVar6;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      pcVar10 = "ppm";
      if (this->_spectrum == 1) {
        pcVar10 = "pgm";
      }
      snprintf(filetmp,0x200,"%s%c%s.%s",pcVar4,0x2f,&cimg::filenamerand()::randomid,pcVar10);
      pFVar5 = fopen(filetmp,"rb");
      if (pFVar5 == (FILE *)0x0) break;
      if ((_stdin != pFVar5) && (_stdout != pFVar5)) {
        iVar2 = fclose(pFVar5);
        if (iVar2 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.");
        }
      }
    }
    _save_pnm(this,(FILE *)0x0,filetmp,0);
    if (cimg::graphicsmagick_path(char_const*,bool)::st_path == (char *)0x0) {
      pcVar4 = (char *)operator_new__(0x400);
      cimg::graphicsmagick_path(char_const*,bool)::st_path = pcVar4;
      memset(pcVar4 + 5,0,0x3fb);
      builtin_strncpy(pcVar4,"./gm",5);
      pFVar5 = fopen(pcVar4,"r");
      pcVar4 = cimg::graphicsmagick_path(char_const*,bool)::st_path;
      if (pFVar5 == (FILE *)0x0) {
        cimg::graphicsmagick_path(char_const*,bool)::st_path[2] = '\0';
        pcVar4[0] = 'g';
        pcVar4[1] = 'm';
      }
      else if ((_stdin != pFVar5) && (_stdout != pFVar5)) {
        uVar9 = fclose(pFVar5);
        if (uVar9 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar9);
        }
      }
    }
    snprintf(command,0x400,"%s -quality %u%% \"%s\" \"%s\"",
             cimg::graphicsmagick_path(char_const*,bool)::st_path,(ulong)quality,filetmp,filename);
    system(command);
    pFVar5 = fopen(filename,"rb");
    if (pFVar5 != (FILE *)0x0) {
      if ((_stdin != pFVar5) && (_stdout != pFVar5)) {
        uVar9 = fclose(pFVar5);
        if (uVar9 != 0) {
          cimg::warn("cimg::fclose() : Error code %d returned during file closing.",(ulong)uVar9);
        }
      }
      remove(filetmp);
      return this;
    }
    this_00 = (CImgIOException *)__cxa_allocate_exception(0x4008);
    pcVar4 = "non-";
    if (this->_is_shared != false) {
      pcVar4 = "";
    }
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_graphicsmagick_external() : Failed to save file \'%s\' with external command \'gm\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar4,"unsigned char",filename);
    ppuVar8 = &CImgIOException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar8,std::exception::~exception);
}

Assistant:

const CImg<T>& save_graphicsmagick_external(const char *const filename, const unsigned int quality=100) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_graphicsmagick_external() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_graphicsmagick_external() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);

      char command[1024] = { 0 }, filetmp[512] = { 0 };
      std::FILE *file;
      do {
        cimg_snprintf(filetmp,sizeof(filetmp),"%s%c%s.%s",cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),_spectrum==1?"pgm":"ppm");
        if ((file=std::fopen(filetmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      save_pnm(filetmp);
      cimg_snprintf(command,sizeof(command),"%s -quality %u%% \"%s\" \"%s\"",cimg::graphicsmagick_path(),quality,filetmp,filename);
      cimg::system(command);
      file = std::fopen(filename,"rb");
      if (!file)
        throw CImgIOException(_cimg_instance
                              "save_graphicsmagick_external() : Failed to save file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      if (file) cimg::fclose(file);
      std::remove(filetmp);
      return *this;
    }